

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

float GD::sensitivity<true,false,false,0ul,1ul,2ul>(gd *g,base_learner *param_2,example *ec)

{
  float fVar1;
  float fVar2;
  
  fVar1 = get_scale<0ul>(g,ec,1.0);
  fVar2 = get_pred_per_update<true,false,false,0ul,1ul,2ul,true>(g,ec);
  return fVar2 * fVar1;
}

Assistant:

float sensitivity(gd& g, base_learner& /* base */, example& ec)
{
  return get_scale<adaptive>(g, ec, 1.) *
      sensitivity<sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare, true>(g, ec);
}